

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_aconst_null(ExecutionEngine *this)

{
  Value operand;
  VMStack *this_00;
  Frame *this_01;
  undefined4 local_30;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand.type = 9;
  operand.printType = local_30;
  operand.data.longValue = 0;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_aconst_null() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;
    value.type = ValueType::REFERENCE;
    value.data.object = NULL;

    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}